

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

void __thiscall amrex::Amr::initSubcycle(Amr *this)

{
  string *__rhs;
  size_type *psVar1;
  ostringstream *this_00;
  pointer piVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  size_type *psVar7;
  char *msg;
  long lVar8;
  ParmParse pp;
  int nosub;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  ParmParse local_208;
  undefined1 local_1b0 [24];
  undefined8 auStack_198 [46];
  
  psVar1 = (size_type *)(local_1b0 + 0x10);
  local_1b0._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"amr","");
  ParmParse::ParmParse(&local_208,(string *)local_1b0);
  if ((size_type *)local_1b0._0_8_ != psVar1) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  this->sub_cycle = 1;
  bVar3 = ParmParse::contains(&local_208,"nosub");
  if (bVar3) {
    if ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose != 0) {
      local_1b0._8_8_ = OutStream();
      this_00 = (ostringstream *)(local_1b0 + 0x10);
      local_1b0._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
      local_1b0._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream(this_00);
      *(undefined8 *)((long)auStack_198 + *(long *)(local_1b0._16_8_ - 0x18)) =
           *(undefined8 *)(local_1b0._8_8_ + *(long *)(*(long *)local_1b0._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Warning: The nosub flag has been deprecated.\n ",0x2e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"... please use subcycling_mode to control subcycling.\n",0x36);
      Print::~Print((Print *)local_1b0);
    }
    ParmParse::query(&local_208,"nosub",(int *)local_1b0,0);
    if ((int)local_1b0._0_4_ < 1) {
      Error_host("nosub <= 0 not allowed.\n");
    }
    else {
      this->sub_cycle = 0;
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->subcycling_mode,0,(char *)(this->subcycling_mode)._M_string_length,
               0x775a27);
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)&this->subcycling_mode,0,(char *)(this->subcycling_mode)._M_string_length,
               0x775a2c);
    ParmParse::queryAdd(&local_208,"subcycling_mode",&this->subcycling_mode);
  }
  __rhs = &this->subcycling_mode;
  iVar4 = std::__cxx11::string::compare((char *)__rhs);
  if (iVar4 == 0) {
    this->sub_cycle = 0;
    if (-1 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level) {
      piVar2 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar8 = -1;
      do {
        piVar2[lVar8 + 1] = 1;
        lVar8 = lVar8 + 1;
      } while (lVar8 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level);
    }
    goto LAB_005ab476;
  }
  iVar4 = std::__cxx11::string::compare((char *)__rhs);
  if (iVar4 != 0) {
    iVar4 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar4 == 0) {
      *(this->n_cycle).super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = 1;
      if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level) {
        lVar8 = 0;
        do {
          iVar4 = AmrMesh::MaxRefRatio((AmrMesh *)this,(int)lVar8);
          (this->n_cycle).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [lVar8 + 1] = iVar4;
          lVar8 = lVar8 + 1;
        } while (lVar8 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level);
      }
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar4 == 0) {
        *(this->n_cycle).super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = 1;
        if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level) {
          lVar8 = 0;
          do {
            iVar4 = AmrMesh::MaxRefRatio((AmrMesh *)this,(int)lVar8);
            (this->n_cycle).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [lVar8 + 1] = iVar4;
            lVar8 = lVar8 + 1;
          } while (lVar8 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level);
        }
      }
      else {
        std::operator+(&local_228,"Unrecognzied subcycling mode: ",__rhs);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_228);
        psVar7 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar7) {
          local_1b0._16_8_ = *psVar7;
          auStack_198[0] = plVar6[3];
          local_1b0._0_8_ = psVar1;
        }
        else {
          local_1b0._16_8_ = *psVar7;
          local_1b0._0_8_ = (size_type *)*plVar6;
        }
        local_1b0._8_8_ = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        Error_host((char *)local_1b0._0_8_);
        if ((size_type *)local_1b0._0_8_ != psVar1) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
      }
    }
    goto LAB_005ab476;
  }
  iVar4 = ParmParse::countval(&local_208,"subcycling_iterations",-1);
  if (iVar4 == 1) {
    local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
    ParmParse::get(&local_208,"subcycling_iterations",(int *)local_1b0,0);
    piVar2 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    *piVar2 = 1;
    if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level) {
      lVar8 = 0;
      do {
        piVar2[lVar8 + 1] = local_1b0._0_4_;
        lVar8 = lVar8 + 1;
      } while (lVar8 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level);
    }
  }
  else {
    if (iVar4 < 2) {
      msg = "Must provide a valid subcycling_iterations if mode is Manual";
    }
    else {
      ParmParse::getarr(&local_208,"subcycling_iterations",
                        &(this->n_cycle).super_vector<int,_std::allocator<int>_>,0,
                        (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level + 1);
      if (*(this->n_cycle).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start ==
          1) goto LAB_005ab3ac;
      msg = "First entry of subcycling_iterations must be 1";
    }
    Error_host(msg);
  }
LAB_005ab3ac:
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level) {
    lVar8 = 0;
    do {
      iVar4 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [lVar8 + 1];
      iVar5 = AmrMesh::MaxRefRatio((AmrMesh *)this,(int)lVar8);
      if (iVar5 < iVar4) {
        Error_host("subcycling iterations must always be <= ref_ratio");
      }
      if ((this->n_cycle).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [lVar8 + 1] < 1) {
        Error_host("subcycling iterations must always be > 0");
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level);
  }
LAB_005ab476:
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_208);
  return;
}

Assistant:

void
Amr::initSubcycle ()
{
    BL_PROFILE("Amr::initSubcycle()");
    ParmParse pp("amr");
    sub_cycle = true;
    if (pp.contains("nosub"))
    {
        if (verbose) {
            amrex::Print() << "Warning: The nosub flag has been deprecated.\n "
                           << "... please use subcycling_mode to control subcycling.\n";
        }
        int nosub;
        pp.query("nosub",nosub);
        if (nosub > 0)
            sub_cycle = false;
        else
            amrex::Error("nosub <= 0 not allowed.\n");
        subcycling_mode = "None";
    }
    else
    {
        subcycling_mode = "Auto";
        pp.queryAdd("subcycling_mode",subcycling_mode);
    }

    if (subcycling_mode == "None")
    {
        sub_cycle = false;
        for (int i = 0; i <= max_level; i++)
        {
            n_cycle[i] = 1;
        }
    }
    else if (subcycling_mode == "Manual")
    {
        int cnt = pp.countval("subcycling_iterations");

        if (cnt == 1)
        {
            //
            // Set all values to the single available value.
            //
            int cycles = 0;

            pp.get("subcycling_iterations",cycles);

            n_cycle[0] = 1; // coarse level is always 1 cycle
            for (int i = 1; i <= max_level; i++)
            {
                n_cycle[i] = cycles;
            }
        }
        else if (cnt > 1)
        {
            //
            // Otherwise we expect a vector of max_grid_size values.
            //
            pp.getarr("subcycling_iterations",n_cycle,0,max_level+1);
            if (n_cycle[0] != 1)
            {
                amrex::Error("First entry of subcycling_iterations must be 1");
            }
        }
        else
        {
            amrex::Error("Must provide a valid subcycling_iterations if mode is Manual");
        }
        for (int i = 1; i <= max_level; i++)
        {
            if (n_cycle[i] > MaxRefRatio(i-1))
                amrex::Error("subcycling iterations must always be <= ref_ratio");
            if (n_cycle[i] <= 0)
                amrex::Error("subcycling iterations must always be > 0");
        }
    }
    else if (subcycling_mode == "Auto")
    {
        n_cycle[0] = 1;
        for (int i = 1; i <= max_level; i++)
        {
            n_cycle[i] = MaxRefRatio(i-1);
        }
    }
    else if (subcycling_mode == "Optimal")
    {
        // if subcycling mode is Optimal, n_cycle is set dynamically.
        // We'll initialize it to be Auto subcycling.
        n_cycle[0] = 1;
        for (int i = 1; i <= max_level; i++)
        {
            n_cycle[i] = MaxRefRatio(i-1);
        }
    }
    else
    {
        std::string err_message = "Unrecognzied subcycling mode: " + subcycling_mode + "\n";
        amrex::Error(err_message.c_str());
    }
}